

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::setLayoutItemMargins(QWidgetPrivate *this,int left,int top,int right,int bottom)

{
  if ((((this->leftLayoutItemMargin == left) && (this->topLayoutItemMargin == top)) &&
      (this->rightLayoutItemMargin == right)) && (this->bottomLayoutItemMargin == bottom)) {
    return;
  }
  this->leftLayoutItemMargin = (char)left;
  this->topLayoutItemMargin = (char)top;
  this->rightLayoutItemMargin = (char)right;
  this->bottomLayoutItemMargin = (char)bottom;
  updateGeometry_helper(*(QWidgetPrivate **)(*(long *)&this->field_0x8 + 8),false);
  return;
}

Assistant:

void QWidgetPrivate::setLayoutItemMargins(int left, int top, int right, int bottom)
{
    if (leftLayoutItemMargin == left
        && topLayoutItemMargin == top
        && rightLayoutItemMargin == right
        && bottomLayoutItemMargin == bottom)
        return;

    Q_Q(QWidget);
    leftLayoutItemMargin = (signed char)left;
    topLayoutItemMargin = (signed char)top;
    rightLayoutItemMargin = (signed char)right;
    bottomLayoutItemMargin = (signed char)bottom;
    q->updateGeometry();
}